

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O0

void __thiscall
Description::Description(Description *this,string *name_,int *kind_,int *adr_,int *val_)

{
  int *val__local;
  int *adr__local;
  int *kind__local;
  string *name__local;
  Description *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,(string *)name_);
  this->kind = *kind_;
  this->adr = *adr_;
  this->val = *val_;
  return;
}

Assistant:

Description(const std::string &name_, const int &kind_,
	            const int &adr_, const int &val_) {
		name = name_;
		kind = kind_;
		adr = adr_;
		val = val_;
	}